

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

bool __thiscall SQTable::GetStr(SQTable *this,SQChar *key,SQInteger keylen,SQObjectPtr *val)

{
  SQObjectPtr *pSVar1;
  SQObjectPtr *pSVar2;
  int iVar3;
  SQHash SVar4;
  size_t in_RDX;
  SQChar *in_RSI;
  long in_RDI;
  _HashNode *res;
  _HashNode *n;
  SQHash hash;
  SQTable *obj;
  SQObjectPtr *pSVar5;
  SQObjectPtr *local_38;
  bool local_1;
  
  SVar4 = _hashstr(in_RSI,in_RDX);
  pSVar5 = (SQObjectPtr *)0x0;
  pSVar2 = (SQObjectPtr *)
           (*(long *)(in_RDI + 0x40) + (SVar4 & *(long *)(in_RDI + 0x48) - 1U) * 0x28);
  do {
    local_38 = pSVar2;
    if ((local_38[1].super_SQObject._type == OT_STRING) &&
       (iVar3 = strcmp((char *)&(local_38[1].super_SQObject._unVal.pOuter)->_idx,in_RSI), iVar3 == 0
       )) break;
    pSVar1 = local_38 + 2;
    local_38 = pSVar5;
    pSVar2 = *(SQObjectPtr **)&pSVar1->super_SQObject;
  } while (*(SQObjectPtr **)&pSVar1->super_SQObject != (SQObjectPtr *)0x0);
  if (local_38 == (SQObjectPtr *)0x0) {
    local_1 = false;
  }
  else {
    if ((local_38->super_SQObject)._type == OT_WEAKREF) {
      obj = (SQTable *)((local_38->super_SQObject)._unVal.pString)->_next;
    }
    else {
      obj = (local_38->super_SQObject)._unVal.pTable;
    }
    ::SQObjectPtr::operator=(local_38,(SQObject *)obj);
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool GetStr(const SQChar* key,SQInteger keylen,SQObjectPtr &val)
    {
        SQHash hash = _hashstr(key,keylen);
        _HashNode *n = &_nodes[hash & (_numofnodes - 1)];
        _HashNode *res = NULL;
        do{
            if(sq_type(n->key) == OT_STRING && (scstrcmp(_stringval(n->key),key) == 0)){
                res = n;
                break;
            }
        }while((n = n->next));
        if (res) {
            val = _realval(res->val);
            return true;
        }
        return false;
    }